

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Game::getTeamMember(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
                   Game *this,size_t playerID)

{
  reference rVar1;
  reference rVar2;
  size_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (local_38 = 0;
      local_38 <
      (ulong)(this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      local_38 = local_38 + 1) {
    if (local_38 != playerID) {
      rVar1 = std::vector<bool,_std::allocator<bool>_>::at(&this->m_teams,playerID);
      rVar2 = std::vector<bool,_std::allocator<bool>_>::at(&this->m_teams,local_38);
      if (((*rVar1._M_p & rVar1._M_mask) != 0) != ((*rVar2._M_p & rVar2._M_mask) == 0)) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (__return_storage_ptr__,&local_38);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> Game::getTeamMember(size_t playerID) {
    std::vector<size_t> members;
    for (size_t i = 0; i < m_teams.size(); i++) {
        if (i != playerID && m_teams.at(playerID) == m_teams.at(i))
            members.push_back(i);
    }
    return members;
}